

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.cpp
# Opt level: O2

void __thiscall OpenMD::XYZVisitor::writeFrame(XYZVisitor *this,ostream *outStream)

{
  Snapshot *this_00;
  ostream *poVar1;
  pointer pbVar2;
  RealType RVar3;
  Mat3x3d box;
  char buffer [1024];
  Mat3x3d local_470;
  char local_428 [1032];
  
  if ((this->frame).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->frame).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Current Frame does not contain any atoms");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)outStream);
  std::endl<char,std::char_traits<char>>(poVar1);
  this_00 = this->info->sman_->currentSnapshot_;
  Snapshot::getHmat(&local_470,this_00);
  RVar3 = Snapshot::getTime(this_00);
  snprintf(local_428,0x400,"%15.8f;%15.8f%15.8f%15.8f;%15.8f%15.8f%15.8f;%15.8f%15.8f%15.8f",RVar3,
           local_470.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0],
           local_470.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1],
           local_470.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2],
           local_470.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0],
           local_470.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1],
           local_470.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2],
           local_470.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0]);
  poVar1 = std::operator<<(outStream,local_428);
  std::endl<char,std::char_traits<char>>(poVar1);
  for (pbVar2 = (this->frame).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 != (this->frame).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
    poVar1 = std::operator<<(outStream,(string *)pbVar2);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return;
}

Assistant:

void XYZVisitor::writeFrame(std::ostream& outStream) {
    std::vector<std::string>::iterator i;
    char buffer[1024];

    if (frame.empty())
      std::cerr << "Current Frame does not contain any atoms" << std::endl;

    // total number of atoms
    outStream << frame.size() << std::endl;

    // write comment line
    Snapshot* currSnapshot = info->getSnapshotManager()->getCurrentSnapshot();
    Mat3x3d box            = currSnapshot->getHmat();

    snprintf(buffer, 1024,
             "%15.8f;%15.8f%15.8f%15.8f;%15.8f%15.8f%15.8f;%15.8f%15.8f%15.8f",
             currSnapshot->getTime(), box(0, 0), box(0, 1), box(0, 2),
             box(1, 0), box(1, 1), box(1, 2), box(2, 0), box(2, 1), box(2, 2));

    outStream << buffer << std::endl;

    for (i = frame.begin(); i != frame.end(); ++i)
      outStream << *i << std::endl;
  }